

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

int macro_install(void)

{
  uint uVar1;
  t_macro *ptVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  
  lablptr->type = 5;
  uVar5 = 0;
  if ('\0' < symbol[0]) {
    lVar3 = 1;
    do {
      iVar4 = (int)uVar5 + (int)symbol[lVar3];
      uVar1 = (iVar4 >> 5) + (int)symbol[lVar3] + iVar4 * 8;
      uVar5 = (ulong)uVar1;
      lVar3 = lVar3 + 1;
    } while ((ulong)(byte)symbol[0] + 1 != lVar3);
    uVar5 = (ulong)(byte)uVar1;
  }
  ptVar2 = (t_macro *)malloc(0x50);
  mptr = ptVar2;
  if (ptVar2 == (t_macro *)0x0) {
    error("Out of memory!");
  }
  else {
    strcpy(ptVar2->name,symbol + 1);
    ptVar2->line = (t_line *)0x0;
    ptVar2->next = macro_tbl[uVar5];
    macro_tbl[uVar5] = ptVar2;
    mlptr = (t_line *)0x0;
  }
  return (uint)(ptVar2 != (t_macro *)0x0);
}

Assistant:

int
macro_install(void)
{
	char c;
	int hash = 0;
	int i;

	/* mark the macro name as reserved */
	lablptr->type = MACRO;

	/* check macro name syntax */
	/*
	if (strchr(&symbol[1], '.')) {
		error("Invalid macro name!");
		return (0);
	}
	*/

	/* calculate symbol hash value */
	for (i = 1; i <= symbol[0]; i++) {
		c = symbol[i];
		hash += c;
		hash  = (hash << 3) + (hash >> 5) + c;
	}
	hash &= 0xFF;

	/* allocate a macro struct */
	mptr = (void *)malloc(sizeof(struct t_macro));
	if (mptr == NULL) {
		error("Out of memory!");
		return (0);
	}

	/* initialize it */
	strcpy(mptr->name, &symbol[1]);
	mptr->line = NULL;
	mptr->next = macro_tbl[hash];
	macro_tbl[hash] = mptr;
	mlptr = NULL;

	/* ok */
	return (1);
}